

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstdpp.hpp
# Opt level: O0

buffer_t *
zstdpp::compress(buffer_t *__return_storage_ptr__,string_t *data,compress_level_t compress_level)

{
  undefined1 local_38 [8];
  buffer_t comp_buffer;
  compress_level_t compress_level_local;
  string_t *data_local;
  
  comp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = compress_level;
  utils::to_bytes((buffer_t *)local_38,data);
  compress(__return_storage_ptr__,(buffer_t *)local_38,
           comp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline buffer_t compress(const string_t data, compress_level_t compress_level) {
    auto comp_buffer = utils::to_bytes(data);
    return compress(comp_buffer, compress_level);
}